

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall
rlottie::internal::renderer::CompLayer::render
          (CompLayer *this,VPainter *painter,VRle *inheritMask,VRle *matteRle,SurfaceCache *cache)

{
  bool bVar1;
  Layer *in_RDI;
  VPainter *in_R8;
  VBitmap srcBitmap;
  VPainter srcPainter;
  VSize size;
  VSize *this_00;
  VPainter *in_stack_fffffffffffffe60;
  VRect *in_stack_fffffffffffffe68;
  VPainter *this_01;
  size_t in_stack_fffffffffffffe80;
  VPoint local_170;
  undefined1 local_168 [7];
  uint8_t in_stack_fffffffffffffe9f;
  VBitmap *in_stack_fffffffffffffea0;
  VPoint *in_stack_fffffffffffffea8;
  VPainter *in_stack_fffffffffffffeb0;
  SurfaceCache *in_stack_fffffffffffffed0;
  VRasterBuffer *in_stack_fffffffffffffed8;
  VRle *in_stack_fffffffffffffee0;
  VPainter *in_stack_fffffffffffffee8;
  CompLayer *in_stack_fffffffffffffef0;
  VSize local_30;
  VPainter *local_28;
  
  local_28 = in_R8;
  Layer::combinedAlpha(in_RDI);
  bVar1 = vIsZero(0.0);
  if (!bVar1) {
    Layer::combinedAlpha(in_RDI);
    bVar1 = vCompare(0.0,2.020258e-39);
    if (bVar1) {
      renderHelper(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                   (VRle *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    }
    else {
      bVar1 = Layer::complexContent(in_RDI);
      if (bVar1) {
        VPainter::clipBoundingRect((VPainter *)0x15fffd);
        local_30 = VRect::size(in_stack_fffffffffffffe68);
        this_01 = (VPainter *)&stack0xfffffffffffffea0;
        VPainter::VPainter(in_stack_fffffffffffffe60);
        this_00 = &local_30;
        VSize::width(this_00);
        VSize::height(this_00);
        SurfaceCache::make_surface
                  ((SurfaceCache *)in_RDI,in_stack_fffffffffffffe80,(size_t)this_01,
                   (Format)((ulong)local_168 >> 0x38));
        VPainter::begin(local_28,(VBitmap *)this_00);
        renderHelper(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                     (VRle *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        VPainter::end(this_01);
        local_170.mx = 0;
        local_170.my = 0;
        VPoint::VPoint(&local_170);
        Layer::combinedAlpha(in_RDI);
        VPainter::drawBitmap
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                   in_stack_fffffffffffffe9f);
        SurfaceCache::release_surface((SurfaceCache *)local_28,(VBitmap *)this_00);
        VBitmap::~VBitmap((VBitmap *)0x16012e);
        VPainter::~VPainter((VPainter *)0x160138);
      }
      else {
        renderHelper(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                     (VRle *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      }
    }
  }
  return;
}

Assistant:

void renderer::CompLayer::render(VPainter *painter, const VRle &inheritMask,
                                 const VRle &matteRle, SurfaceCache &cache)
{
    if (vIsZero(combinedAlpha())) return;

    if (vCompare(combinedAlpha(), 1.0)) {
        renderHelper(painter, inheritMask, matteRle, cache);
    } else {
        if (complexContent()) {
            VSize    size = painter->clipBoundingRect().size();
            VPainter srcPainter;
            VBitmap srcBitmap = cache.make_surface(size.width(), size.height());
            srcPainter.begin(&srcBitmap);
            renderHelper(&srcPainter, inheritMask, matteRle, cache);
            srcPainter.end();
            painter->drawBitmap(VPoint(), srcBitmap,
                                uint8_t(combinedAlpha() * 255.0f));
            cache.release_surface(srcBitmap);
        } else {
            renderHelper(painter, inheritMask, matteRle, cache);
        }
    }
}